

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

ChGenotype * __thiscall
chrono::ChOptimizerGenetic::Select_roulette(ChOptimizerGenetic *this,ChGenotype **my_population)

{
  ChGenotype **ppCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ChGenotype *pCVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  ChGenotype *pCVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pCVar5 = *my_population;
  pCVar9 = Select_worst(this,my_population);
  dVar16 = pCVar9->fitness;
  pCVar9 = Select_best(this,my_population);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar16;
  uVar4 = *(uint *)&(this->super_ChOptimizer).field_0x144;
  dVar11 = 0.0;
  uVar10 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->eugenetics;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = pCVar9->fitness - dVar16;
  auVar3 = vfmadd132sd_fma(auVar17,auVar12,auVar3);
  while ((~((int)uVar4 >> 0x1f) & uVar4) != uVar10) {
    ppCVar1 = my_population + uVar10;
    uVar10 = uVar10 + 1;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (*ppCVar1)->fitness;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar14,auVar8);
    uVar6 = vcmpsd_avx512f(auVar12,ZEXT816(0x412e847e00000000),4);
    bVar7 = (bool)((byte)uVar6 & 1);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (*ppCVar1)->fitness - auVar3._0_8_;
    auVar12 = vmaxsd_avx(ZEXT816(0),auVar15);
    dVar11 = (double)((ulong)bVar7 * (long)(dVar11 + auVar12._0_8_) + (ulong)!bVar7 * (long)dVar11);
  }
  dVar13 = ChRandom();
  auVar20._8_8_ = 0x7fffffffffffffff;
  auVar20._0_8_ = 0x7fffffffffffffff;
  uVar4 = *(uint *)&(this->super_ChOptimizer).field_0x144;
  dVar16 = 0.0;
  uVar10 = 0;
  do {
    if ((~((int)uVar4 >> 0x1f) & uVar4) == uVar10) {
      return pCVar5;
    }
    dVar2 = my_population[uVar10]->fitness;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar2;
    auVar12 = vandpd_avx(auVar18,auVar20);
    if ((auVar12._0_8_ != 999999.0) || (NAN(auVar12._0_8_))) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar2 - auVar3._0_8_;
      auVar12 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar19);
      dVar16 = dVar16 + auVar12._0_8_;
      if (dVar13 * dVar11 <= dVar16) {
        return my_population[uVar10];
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_roulette(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];

    // compute sum of all fitness, relative to worst.
    double msum = 0;
    double norm_fitness;
    double minf_fit = Select_worst(my_population)->fitness;
    double msup_fit = Select_best(my_population)->fitness;
    double clamp_fit = minf_fit + eugenetics * (msup_fit - minf_fit);

    int i;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            msum = msum + norm_fitness;
        }
    }

    double number = ChRandom() * msum;  // the sorted-out number!
    double partialsum = 0;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            partialsum = partialsum + norm_fitness;
            if (partialsum >= number)
                return my_population[i];  // the number was ok.
        }
    }
    // default .
    return mselected;
}